

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetConfidentialTxOutIndex
              (void *handle,char *tx_hex_string,char *address,char *direct_locking_script,
              uint32_t *index)

{
  bool bVar1;
  CfdException *pCVar2;
  string addr_str;
  ElementsAddressFactory address_factory;
  ElementsConfidentialAddress local_588;
  Address addr;
  ConfidentialTransactionContext tx;
  Address local_1a8;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    local_588.unblinded_address_._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_588.unblinded_address_.witness_ver_ = 0x38a;
    local_588.unblinded_address_.address_._M_dataplus._M_p = "CfdGetConfidentialTxOutIndex";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_588,"tx is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_588,"Failed to parameter. tx is null or empty.",(allocator *)&addr);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_588);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_588,tx_hex_string,(allocator *)&addr);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&tx,(string *)&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  bVar1 = cfd::capi::IsEmptyString(direct_locking_script);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(address);
    if (bVar1) {
      bVar1 = cfd::ConfidentialTransactionContext::IsFindFeeTxOut(&tx,index);
      if (bVar1) goto LAB_003662ad;
      goto LAB_003660cc;
    }
    cfd::ElementsAddressFactory::ElementsAddressFactory(&address_factory);
    std::__cxx11::string::string((string *)&addr_str,address,(allocator *)&local_588);
    cfd::core::Address::Address(&addr);
    bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&addr_str);
    if (bVar1) {
      cfd::ElementsAddressFactory::GetConfidentialAddress(&local_588,&address_factory,&addr_str);
      cfd::core::ElementsConfidentialAddress::GetUnblindedAddress(&local_1a8,&local_588);
      cfd::core::Address::operator=(&addr,&local_1a8);
      cfd::core::Address::~Address(&local_1a8);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_588);
    }
    else {
      cfd::AddressFactory::GetAddress
                (&local_588.unblinded_address_,&address_factory.super_AddressFactory,&addr_str);
      cfd::core::Address::operator=(&addr,&local_588.unblinded_address_);
      cfd::core::Address::~Address(&local_588.unblinded_address_);
    }
    bVar1 = cfd::ConfidentialTransactionContext::IsFindTxOut
                      (&tx,&addr,index,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
    cfd::core::Address::~Address(&addr);
    std::__cxx11::string::~string((string *)&addr_str);
    cfd::AddressFactory::~AddressFactory(&address_factory.super_AddressFactory);
  }
  else {
    std::__cxx11::string::string((string *)&addr,direct_locking_script,(allocator *)&local_1a8);
    cfd::core::Script::Script((Script *)&local_588,(string *)&addr);
    bVar1 = cfd::ConfidentialTransactionContext::IsFindTxOut
                      (&tx,(Script *)&local_588,index,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
    cfd::core::Script::~Script((Script *)&local_588);
    std::__cxx11::string::~string((string *)&addr);
  }
  if (bVar1 != false) {
LAB_003662ad:
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx);
    return 0;
  }
LAB_003660cc:
  local_588.unblinded_address_._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_588.unblinded_address_.witness_ver_ = 0x3a5;
  local_588.unblinded_address_.address_._M_dataplus._M_p = "CfdGetConfidentialTxOutIndex";
  cfd::core::logger::warn<>((CfdSourceLocation *)&local_588,"target not found.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_588,"Failed to parameter. search target is not found.",
             (allocator *)&addr);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_588);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxOutIndex(
    void* handle, const char* tx_hex_string, const char* address,
    const char* direct_locking_script, uint32_t* index) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionContext tx(tx_hex_string);
    bool is_find = false;

    if (!IsEmptyString(direct_locking_script)) {
      is_find = tx.IsFindTxOut(Script(direct_locking_script), index);
    } else if (!IsEmptyString(address)) {
      ElementsAddressFactory address_factory;
      std::string addr_str(address);
      Address addr;
      if (ElementsConfidentialAddress::IsConfidentialAddress(addr_str)) {
        addr = address_factory.GetConfidentialAddress(addr_str)
                   .GetUnblindedAddress();
      } else {
        addr = address_factory.GetAddress(addr_str);
      }
      is_find = tx.IsFindTxOut(addr, index);
    } else {
      // fee
      is_find = tx.IsFindFeeTxOut(index);
    }
    if (!is_find) {
      warn(CFD_LOG_SOURCE, "target not found.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. search target is not found.");
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}